

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O2

int wwCmp_fast(word *a,word *b,size_t n)

{
  bool bVar1;
  
  while( true ) {
    bVar1 = n == 0;
    n = n - 1;
    if (bVar1) {
      return 0;
    }
    if (b[n] < a[n]) break;
    if (a[n] < b[n]) {
      return -1;
    }
  }
  return 1;
}

Assistant:

int FAST(wwCmp)(const word a[], const word b[], size_t n)
{
	ASSERT(wwIsValid(a, n) && wwIsValid(b, n));
	while (n--)
		if (a[n] > b[n])
			return 1;
		else if (a[n] < b[n])
			return -1;
	return 0;
}